

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

basic_variable<std::allocator<char>_> *
trial::dynamic::convert::
overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_void>
::into(basic_variable<std::allocator<char>_> *__return_storage_ptr__,
      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *map,
      error_code *param_2)

{
  bool bVar1;
  int in_ECX;
  basic_variable<std::allocator<char>_> local_78;
  reference local_48;
  pair<const_int,_int> *entry;
  const_iterator __end0;
  const_iterator __begin0;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *__range3;
  error_code *param_1_local;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *map_local;
  basic_variable<std::allocator<char>_> *result;
  
  basic_map<std::allocator<char>_>::make();
  __end0 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                     (map);
  entry = (pair<const_int,_int> *)
          std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end(map);
  while (bVar1 = std::operator!=(&__end0,(_Self *)&entry), bVar1) {
    local_48 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator*(&__end0);
    basic_map<std::allocator<char>>::make<int,int>
              (&local_78,(basic_map<std::allocator<char>> *)(ulong)(uint)local_48->first,
               local_48->second,in_ECX);
    basic_variable<std::allocator<char>_>::operator+=(__return_storage_ptr__,&local_78);
    basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
    std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

static basic_variable<Allocator> into(const std::map<Key, Value>& map,
                                          std::error_code&)
    {
        auto result = basic_map<Allocator>::make();
        for (const auto& entry : map)
        {
            result += map::make(entry.first, entry.second);
        }
        return result;
    }